

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGeneric.cpp
# Opt level: O3

void __thiscall
chrono::ChVariablesGeneric::Build_M
          (ChVariablesGeneric *this,ChSparseMatrix *storage,int insrow,int inscol,double c_a)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows;
  if (0 < lVar3) {
    lVar1 = (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
            .m_cols;
    lVar4 = 0;
    lVar2 = 0;
    do {
      if (0 < lVar1) {
        lVar3 = 0;
        do {
          if ((this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_rows <= lVar2) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                         );
          }
          (**storage->_vptr_SparseMatrix)
                    (c_a * *(double *)
                            ((long)(this->Mmass).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                                   m_storage.m_data + lVar3 * 8 + lVar1 * lVar4),storage,
                     (ulong)(uint)((int)lVar2 + insrow),(ulong)(uint)(inscol + (int)lVar3),1);
          lVar1 = (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols;
          lVar3 = lVar3 + 1;
        } while (lVar3 < lVar1);
        lVar3 = (this->Mmass).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_rows;
      }
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar2 < lVar3);
  }
  return;
}

Assistant:

void ChVariablesGeneric::Build_M(ChSparseMatrix& storage, int insrow, int inscol, const double c_a) {
    for (int row = 0; row < Mmass.rows(); ++row)
        for (int col = 0; col < Mmass.cols(); ++col)
            storage.SetElement(insrow + row, inscol + col, c_a * Mmass(row, col));
}